

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O2

int BN_ext_count_low_zero_bits(BIGNUM *bn)

{
  int iVar1;
  int iVar2;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
  CVar3;
  byte bVar4;
  S2LogMessage local_130;
  FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> bytes;
  
  iVar1 = BN_num_bits((BIGNUM *)bn);
  bytes.storage_.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
  .
  super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
  .value = (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
            )(long)((iVar1 + 7) / 8);
  bytes.storage_.data_ =
       absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
       Storage::InitializeData(&bytes.storage_);
  iVar1 = BN_bn2lebinpad(bn,bytes.storage_.data_,
                         (ulong)bytes.storage_.size_alloc_.
                                super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                                .
                                super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                                .value & 0xffffffff);
  if (bytes.storage_.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value != (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 )(long)iVar1) {
    S2LogMessage::S2LogMessage
              (&local_130,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x8b,kFatal,(ostream *)&std::cerr);
    std::operator<<(local_130.stream_,
                    "Check failed: (BN_bn2lebinpad(bn, bytes.data(), bytes.size())) == (bytes.size()) "
                   );
    abort();
  }
  iVar2 = (int)bytes.storage_.size_alloc_.
               super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
               .
               super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
               .value * 8;
  iVar1 = 0;
  for (CVar3.
       super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
       .value = (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                 )0;
      bytes.storage_.size_alloc_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value != (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_absl::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 )CVar3.
                  super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                  .value;
      CVar3.
      super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
      .value = (Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                )((long)CVar3.
                        super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                        .value + 1)) {
    bVar4 = bytes.storage_.data_
            [(long)CVar3.
                   super_Storage<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<unsigned_char>_>,_0UL,_false>
                   .value];
    if (bVar4 != 0) goto LAB_0026ab93;
    iVar1 = iVar1 + 8;
  }
LAB_0026ab9b:
  absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::Storage::
  ~Storage(&bytes.storage_);
  return iVar2;
LAB_0026ab93:
  for (; iVar2 = iVar1, (bVar4 & 1) == 0; bVar4 = bVar4 >> 1) {
    iVar1 = iVar2 + 1;
  }
  goto LAB_0026ab9b;
}

Assistant:

static int BN_ext_count_low_zero_bits(const BIGNUM* bn) {
  // In OpenSSL >= 1.1, BIGNUM is an opaque type, so d and top
  // cannot be accessed.  The bytes must be copied out at a ~25%
  // performance penalty.
  absl::FixedArray<unsigned char> bytes(BN_num_bytes(bn));
  // "le" indicates little endian.
  S2_CHECK_EQ(BN_bn2lebinpad(bn, bytes.data(), bytes.size()), bytes.size());

  int count = 0;
  for (unsigned char c : bytes) {
    if (c == 0) {
      count += 8;
    } else {
      for (; (c & 1) == 0; c >>= 1) {
        ++count;
      }
      break;
    }
  }
  return count;
}